

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBGrayRow_C(uint8_t *src_argb,uint8_t *dst_argb,int width)

{
  undefined1 uVar1;
  int iVar2;
  int in_EDX;
  undefined1 *in_RSI;
  uint8_t *in_RDI;
  uint8_t y;
  int x;
  int local_18;
  undefined1 *local_10;
  uint8_t *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < in_EDX; local_18 = local_18 + 1) {
    iVar2 = libyuv::RGBToYJ(local_8[2],local_8[1],*local_8);
    uVar1 = (undefined1)iVar2;
    *local_10 = uVar1;
    local_10[1] = uVar1;
    local_10[2] = uVar1;
    local_10[3] = local_8[3];
    local_10 = local_10 + 4;
    local_8 = local_8 + 4;
  }
  return;
}

Assistant:

void ARGBGrayRow_C(const uint8_t* src_argb, uint8_t* dst_argb, int width) {
  int x;
  for (x = 0; x < width; ++x) {
    uint8_t y = RGBToYJ(src_argb[2], src_argb[1], src_argb[0]);
    dst_argb[2] = dst_argb[1] = dst_argb[0] = y;
    dst_argb[3] = src_argb[3];
    dst_argb += 4;
    src_argb += 4;
  }
}